

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFxu.c
# Opt level: O1

void Abc_NtkSetDefaultFxParams(Fxu_Data_t *p)

{
  p->nPairsMax = 0;
  p->WeightMin = 0;
  p->LitCountMax = 0;
  p->fCanonDivs = 0;
  p->fVerbose = 0;
  p->fVeryVerbose = 0;
  p->nNodesExt = 0;
  p->nSingleMax = 0;
  p->pManSop = (Mem_Flex_t *)0x0;
  p->nNodesOld = 0;
  p->nNodesNew = 0;
  p->vSopsNew = (Vec_Ptr_t *)0x0;
  p->vFaninsNew = (Vec_Ptr_t *)0x0;
  p->vSops = (Vec_Ptr_t *)0x0;
  p->vFanins = (Vec_Ptr_t *)0x0;
  p->nPairsMax = 30000;
  p->nNodesExt = 1000000;
  p->nSingleMax = 20000;
  p->WeightMin = 0;
  p->LitCountMax = 4;
  p->fOnlyS = 0;
  p->fOnlyD = 0;
  p->fUse0 = 0;
  p->fUseCompl = 1;
  p->fVerbose = 0;
  return;
}

Assistant:

void Abc_NtkSetDefaultFxParams( Fxu_Data_t * p )
{
    memset( p, 0, sizeof(Fxu_Data_t) );
    p->nSingleMax =  20000;
    p->nPairsMax  =  30000;
    p->nNodesExt  =1000000;
    p->WeightMin  =      0;
    p->LitCountMax=      4;
    p->fOnlyS     =      0;
    p->fOnlyD     =      0;
    p->fUse0      =      0;
    p->fUseCompl  =      1;
    p->fVerbose   =      0;
}